

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

uint cimg_library::cimg::_wait(uint milliseconds,unsigned_long *timer)

{
  unsigned_long uVar1;
  ulong uVar2;
  long lVar3;
  undefined4 in_register_0000003c;
  time_t *__timer;
  unsigned_long time_diff;
  unsigned_long current_time;
  unsigned_long *timer_local;
  uint milliseconds_local;
  
  __timer = (time_t *)CONCAT44(in_register_0000003c,milliseconds);
  if (*timer == 0) {
    uVar1 = time(__timer);
    *timer = uVar1;
  }
  uVar2 = time(__timer);
  if (uVar2 < *timer + (ulong)milliseconds) {
    lVar3 = (*timer + (ulong)milliseconds) - uVar2;
    *timer = uVar2 + lVar3;
    timer_local._4_4_ = (uint)lVar3;
    sleep(timer_local._4_4_);
  }
  else {
    *timer = uVar2;
    timer_local._4_4_ = 0;
  }
  return timer_local._4_4_;
}

Assistant:

inline unsigned int _wait(const unsigned int milliseconds, unsigned long& timer) {
      if (!timer) timer = cimg::time();
      const unsigned long current_time = cimg::time();
      if (current_time>=timer+milliseconds) { timer = current_time; return 0; }
      const unsigned long time_diff = timer + milliseconds - current_time;
      timer = current_time + time_diff;
      cimg::sleep(time_diff);
      return (unsigned int)time_diff;
    }